

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O0

void __thiscall
sqlcheck::TestSuite_GenericPrimaryKeyTest_Test::TestBody(TestSuite_GenericPrimaryKeyTest_Test *this)

{
  istringstream *this_00;
  pointer pbVar1;
  allocator local_e1;
  string local_e0 [48];
  unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stream;
  Configuration default_conf;
  TestSuite_GenericPrimaryKeyTest_Test *this_local;
  
  default_conf._144_8_ = this;
  Configuration::Configuration((Configuration *)&stream);
  default_conf.test_stream._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = 1;
  default_conf.delimiter.field_2._M_local_buf[0xc] = '\0';
  this_00 = (istringstream *)operator_new(0x180);
  std::__cxx11::istringstream::istringstream(this_00);
  std::unique_ptr<std::__cxx11::istringstream,std::default_delete<std::__cxx11::istringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::istringstream>,void>
            ((unique_ptr<std::__cxx11::istringstream,std::default_delete<std::__cxx11::istringstream>>
              *)&local_b0,(pointer)this_00);
  pbVar1 = std::
           unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,
             "CREATE TABLE BugsProducts (id SERIAL PRIMARY KEY,bug_id      BIGINT UNSIGNED NOT NULL,product_id  BIGINT UNSIGNED NOT NULL,UNIQUE KEY (bug_id, product_id),FOREIGN KEY (bug_id) REFERENCES Bugs(bug_id),FOREIGN KEY (product_id) REFERENCES Products(product_id));\nCREATE TABLE BugsProducts (bug_id      BIGINT UNSIGNED NOT NULL,id SERIAL PRIMARY KEY,product_id  BIGINT UNSIGNED NOT NULL,UNIQUE KEY (bug_id, product_id),FOREIGN KEY (bug_id) REFERENCES Bugs(bug_id),FOREIGN KEY (product_id) REFERENCES Products(product_id));\n"
             ,&local_e1);
  std::__cxx11::istringstream::str((string *)pbVar1);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pbVar1 = std::
           unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::release(&local_b0);
  std::
  unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reset((unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&default_conf.risk_level,pbVar1);
  Check((Configuration *)&stream);
  std::
  unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&local_b0);
  Configuration::~Configuration((Configuration *)&stream);
  return;
}

Assistant:

TEST(TestSuite, GenericPrimaryKeyTest) {

  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(

      "CREATE TABLE BugsProducts ("
      "id SERIAL PRIMARY KEY,"
      "bug_id      BIGINT UNSIGNED NOT NULL,"
      "product_id  BIGINT UNSIGNED NOT NULL,"
      "UNIQUE KEY (bug_id, product_id),"
      "FOREIGN KEY (bug_id) REFERENCES Bugs(bug_id),"
      "FOREIGN KEY (product_id) REFERENCES Products(product_id));\n"

      "CREATE TABLE BugsProducts ("
      "bug_id      BIGINT UNSIGNED NOT NULL,"
      "id SERIAL PRIMARY KEY,"
      "product_id  BIGINT UNSIGNED NOT NULL,"
      "UNIQUE KEY (bug_id, product_id),"
      "FOREIGN KEY (bug_id) REFERENCES Bugs(bug_id),"
      "FOREIGN KEY (product_id) REFERENCES Products(product_id));\n"
  );

  default_conf.test_stream.reset(stream.release());

  Check(default_conf);

}